

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall Lib::Array<unsigned_int>::Array(Array<unsigned_int> *this,Array<unsigned_int> *o)

{
  void *pvVar1;
  long in_RSI;
  undefined8 *in_RDI;
  size_t i;
  void *mem;
  size_t in_stack_ffffffffffffffe0;
  ulong uVar2;
  
  *in_RDI = &PTR_fillInterval_01309018;
  in_RDI[1] = *(undefined8 *)(in_RSI + 8);
  if (*(long *)(in_RSI + 0x10) == 0) {
    in_RDI[2] = 0;
  }
  else {
    pvVar1 = Lib::alloc(in_stack_ffffffffffffffe0);
    in_RDI[2] = pvVar1;
    for (uVar2 = 0; uVar2 < (ulong)in_RDI[1]; uVar2 = uVar2 + 1) {
      *(undefined4 *)(in_RDI[2] + uVar2 * 4) = *(undefined4 *)(*(long *)(in_RSI + 0x10) + uVar2 * 4)
      ;
    }
  }
  return;
}

Assistant:

Array (const Array &o) : _capacity(o._capacity) {
    if (o._array) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),"Array<>");
      _array = static_cast<C*>(mem);
      for(size_t i=0; i<_capacity; i++) {
        ::new (&_array[i]) C(o._array[i]);
      }
    } else {
      _array = 0;
    }
  }